

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode exit_zlib(connectdata *conn,z_stream *z,zlibInitState *zlib_init,CURLcode result)

{
  int iVar1;
  
  if (*zlib_init == ZLIB_GZIP_HEADER) {
    (*Curl_cfree)(z->next_in);
    z->next_in = (Bytef *)0x0;
  }
  if (*zlib_init != ZLIB_UNINIT) {
    iVar1 = inflateEnd(z);
    if ((result == CURLE_OK) && (iVar1 != 0)) {
      process_zlib_error(conn,z);
      result = CURLE_BAD_CONTENT_ENCODING;
    }
    *zlib_init = ZLIB_UNINIT;
  }
  return result;
}

Assistant:

static CURLcode
exit_zlib(struct connectdata *conn,
          z_stream *z, zlibInitState *zlib_init, CURLcode result)
{
  if(*zlib_init == ZLIB_GZIP_HEADER)
    Curl_safefree(z->next_in);

  if(*zlib_init != ZLIB_UNINIT) {
    if(inflateEnd(z) != Z_OK && result == CURLE_OK)
      result = process_zlib_error(conn, z);
    *zlib_init = ZLIB_UNINIT;
  }

  return result;
}